

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  allocator_type *paVar3;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar4;
  int i_8;
  float in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  int in_stack_000000f0;
  int in_stack_000000f4;
  float scale_3;
  int i_7;
  Mat *in_stack_00000100;
  int in_stack_00000110;
  Allocator *in_stack_00000118;
  int in_stack_00000120;
  float scale_2;
  int i_6;
  float scale_1;
  int i_5;
  float scale;
  float val_1;
  int k_1;
  float sum_1;
  float *sptr_1;
  int j_2;
  int i_4;
  float *outptr_1;
  Mat m_1;
  int q_3;
  float val;
  int k;
  float max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr;
  Mat m;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  int hpad;
  int wpad;
  int htail;
  int wtail;
  int htailpad;
  int wtailpad;
  float pad_value;
  Mat bottom_blob_bordered;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  allocator_type *in_stack_fffffffffffffba0;
  size_type in_stack_fffffffffffffba8;
  Mat *in_stack_fffffffffffffbb0;
  int local_3bc;
  Mat local_3b8;
  float local_380;
  int local_37c;
  Mat local_378;
  float local_340;
  int local_33c;
  Mat local_338;
  float local_300;
  int local_2fc;
  Mat local_2f8;
  float local_2c0;
  float local_2bc;
  int local_2b8;
  float local_2b4;
  float *local_2b0;
  int local_2a8;
  int local_2a4;
  Mat local_2a0;
  allocator_type *local_268;
  Mat local_260;
  int local_228;
  float local_224;
  int local_220;
  float local_21c;
  float *local_218;
  int local_210;
  int local_20c;
  Mat local_208;
  float *local_1d0;
  Mat local_1c8;
  int local_190;
  int local_18c;
  int local_188;
  int local_184;
  int local_180;
  int local_17c;
  reference local_178;
  vector<int,_std::allocator<int>_> local_168;
  int local_14c;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  undefined4 local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  undefined4 local_124;
  Mat local_120;
  int local_e8;
  float local_e4;
  Mat local_e0;
  float *local_a8;
  int local_a0;
  int local_9c;
  float local_98 [4];
  Mat local_88;
  float *local_50;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  long local_28;
  Mat *local_20;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  if (*(int *)(in_RDI + 0xa4) != 0) {
    local_20 = in_RDX;
    Mat::create(in_stack_fffffffffffffbb0,(int)(in_stack_fffffffffffffba8 >> 0x20),
                (size_t)in_stack_fffffffffffffba0,
                (Allocator *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    bVar1 = Mat::empty(in_stack_fffffffffffffb90);
    if (!bVar1) {
      local_44 = local_2c * local_30;
      if (*(int *)(in_RDI + 0x80) == 0) {
        for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_88);
          Mat::~Mat((Mat *)0x120acb);
          local_98[0] = *pfVar2;
          local_50 = pfVar2;
          for (local_9c = 0; fVar4 = local_98[0], local_9c < local_44; local_9c = local_9c + 1) {
            pfVar2 = std::max<float>(local_98,local_50 + local_9c);
            local_98[0] = *pfVar2;
          }
          pfVar2 = Mat::operator[](local_20,local_48);
          *pfVar2 = fVar4;
        }
      }
      else if (*(int *)(in_RDI + 0x80) == 1) {
        for (local_a0 = 0; local_a0 < local_34; local_a0 = local_a0 + 1) {
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_e0);
          Mat::~Mat((Mat *)0x120c3f);
          local_e4 = 0.0;
          for (local_e8 = 0; local_e8 < local_44; local_e8 = local_e8 + 1) {
            local_e4 = pfVar2[local_e8] + local_e4;
          }
          fVar4 = local_e4 / (float)local_44;
          local_a8 = pfVar2;
          pfVar2 = Mat::operator[](local_20,local_a0);
          *pfVar2 = fVar4;
        }
      }
      return 0;
    }
    return -100;
  }
  local_28 = in_RCX;
  Mat::Mat(&local_120,in_RSI);
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_124 = 0xff7fffff;
  }
  else {
    local_124 = 0;
  }
  local_128 = 0;
  local_12c = 0;
  if (*(int *)(in_RDI + 0xa8) == 0) {
    local_130 = ((local_2c + *(int *)(in_RDI + 0x94) + *(int *)(in_RDI + 0x98)) -
                *(int *)(in_RDI + 0x84)) % *(int *)(in_RDI + 0x8c);
    local_134 = ((local_30 + *(int *)(in_RDI + 0x9c) + *(int *)(in_RDI + 0xa0)) -
                *(int *)(in_RDI + 0x88)) % *(int *)(in_RDI + 0x90);
    if (local_130 != 0) {
      local_128 = *(int *)(in_RDI + 0x8c) - local_130;
    }
    if (local_134 != 0) {
      local_12c = *(int *)(in_RDI + 0x90) - local_134;
    }
    in_stack_fffffffffffffb90 = *(Mat **)(local_28 + 0x10);
    in_stack_fffffffffffffb98 = *(undefined4 *)(local_28 + 4);
    copy_make_border(in_stack_00000100,_scale_3,in_stack_000000f4,in_stack_000000f0,
                     in_stack_000000ec,in_stack_000000e8,in_stack_00000110,in_stack_000000e4,
                     in_stack_00000118,in_stack_00000120);
    bVar1 = Mat::empty(in_stack_fffffffffffffb90);
    if (bVar1) {
      local_4 = -100;
      local_138 = 1;
      goto LAB_00121e38;
    }
    local_2c = local_120.w;
    local_30 = local_120.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 1) {
    in_stack_fffffffffffffb90 = *(Mat **)(local_28 + 0x10);
    in_stack_fffffffffffffb98 = *(undefined4 *)(local_28 + 4);
    copy_make_border(in_stack_00000100,_scale_3,in_stack_000000f4,in_stack_000000f0,
                     in_stack_000000ec,in_stack_000000e8,in_stack_00000110,in_stack_000000e4,
                     in_stack_00000118,in_stack_00000120);
    bVar1 = Mat::empty(in_stack_fffffffffffffb90);
    if (bVar1) {
      local_4 = -100;
      local_138 = 1;
      goto LAB_00121e38;
    }
    local_2c = local_120.w;
    local_30 = local_120.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 2) {
    local_13c = (*(int *)(in_RDI + 0x84) +
                ((local_2c + -1) / *(int *)(in_RDI + 0x8c)) * *(int *)(in_RDI + 0x8c)) - local_2c;
    local_140 = (*(int *)(in_RDI + 0x88) +
                ((local_30 + -1) / *(int *)(in_RDI + 0x90)) * *(int *)(in_RDI + 0x90)) - local_30;
    if ((0 < local_13c) || (0 < local_140)) {
      in_stack_fffffffffffffb90 = *(Mat **)(local_28 + 0x10);
      in_stack_fffffffffffffb98 = *(undefined4 *)(local_28 + 4);
      copy_make_border(in_stack_00000100,_scale_3,in_stack_000000f4,in_stack_000000f0,
                       in_stack_000000ec,in_stack_000000e8,in_stack_00000110,in_stack_000000e4,
                       in_stack_00000118,in_stack_00000120);
      bVar1 = Mat::empty(in_stack_fffffffffffffb90);
      if (bVar1) {
        local_4 = -100;
        local_138 = 1;
        goto LAB_00121e38;
      }
    }
    local_2c = local_120.w;
    local_30 = local_120.h;
  }
  local_144 = (local_2c - *(int *)(in_RDI + 0x84)) / *(int *)(in_RDI + 0x8c) + 1;
  local_148 = (local_30 - *(int *)(in_RDI + 0x88)) / *(int *)(in_RDI + 0x90) + 1;
  Mat::create(in_stack_fffffffffffffbb0,(int)(in_stack_fffffffffffffba8 >> 0x20),
              (int)in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
              CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
              (Allocator *)in_stack_fffffffffffffb90);
  bVar1 = Mat::empty(in_stack_fffffffffffffb90);
  if (bVar1) {
    local_4 = -100;
    local_138 = 1;
  }
  else {
    local_14c = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    std::allocator<int>::allocator((allocator<int> *)0x1212a3);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    std::allocator<int>::~allocator((allocator<int> *)0x1212c9);
    local_178 = std::vector<int,_std::allocator<int>_>::operator[](&local_168,0);
    local_17c = 0;
    local_180 = 0;
    local_184 = local_2c - *(int *)(in_RDI + 0x84);
    for (local_188 = 0; local_188 < *(int *)(in_RDI + 0x88); local_188 = local_188 + 1) {
      for (local_18c = 0; local_18c < *(int *)(in_RDI + 0x84); local_18c = local_18c + 1) {
        local_178[local_17c] = local_180;
        local_17c = local_17c + 1;
        local_180 = local_180 + 1;
      }
      local_180 = local_184 + local_180;
    }
    if (*(int *)(in_RDI + 0x80) == 0) {
      for (local_190 = 0; local_190 < local_34; local_190 = local_190 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_208);
        Mat::~Mat((Mat *)0x12148d);
        local_1d0 = pfVar2;
        for (local_20c = 0; local_20c < local_148; local_20c = local_20c + 1) {
          for (local_210 = 0; local_210 < local_144; local_210 = local_210 + 1) {
            local_218 = Mat::row(&local_1c8,local_20c * *(int *)(in_RDI + 0x90));
            local_218 = local_218 + local_210 * *(int *)(in_RDI + 0x8c);
            local_21c = *local_218;
            for (local_220 = 0; local_220 < local_14c; local_220 = local_220 + 1) {
              local_224 = local_218[local_178[local_220]];
              pfVar2 = std::max<float>(&local_21c,&local_224);
              local_21c = *pfVar2;
            }
            local_1d0[local_210] = local_21c;
          }
          local_1d0 = local_1d0 + local_144;
        }
        Mat::~Mat((Mat *)0x1216a0);
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 1) {
      for (local_228 = 0; local_228 < local_34; local_228 = local_228 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                     (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
        paVar3 = (allocator_type *)Mat::operator_cast_to_float_(&local_2a0);
        Mat::~Mat((Mat *)0x12175e);
        local_268 = paVar3;
        for (local_2a4 = 0; local_2a4 < local_148; local_2a4 = local_2a4 + 1) {
          for (local_2a8 = 0; local_2a8 < local_144; local_2a8 = local_2a8 + 1) {
            local_2b0 = Mat::row(&local_260,local_2a4 * *(int *)(in_RDI + 0x90));
            local_2b0 = local_2b0 + local_2a8 * *(int *)(in_RDI + 0x8c);
            local_2b4 = 0.0;
            for (local_2b8 = 0; local_2b8 < local_14c; local_2b8 = local_2b8 + 1) {
              local_2bc = local_2b0[local_178[local_2b8]];
              local_2b4 = local_2bc + local_2b4;
            }
            *(float *)(local_268 + (long)local_2a8 * 4) = local_2b4 / (float)local_14c;
          }
          local_268 = local_268 + (long)local_144 * 4;
        }
        if (*(int *)(in_RDI + 0x9c) != 0) {
          local_2c0 = (float)*(int *)(in_RDI + 0x88) /
                      (float)(*(int *)(in_RDI + 0x88) - *(int *)(in_RDI + 0x9c));
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          local_268 = (allocator_type *)Mat::row(&local_2f8,0);
          Mat::~Mat((Mat *)0x1219ca);
          for (local_2fc = 0; local_2fc < local_144; local_2fc = local_2fc + 1) {
            *(float *)(local_268 + (long)local_2fc * 4) =
                 local_2c0 * *(float *)(local_268 + (long)local_2fc * 4);
          }
        }
        if (*(int *)(in_RDI + 0xa0) + local_12c != 0) {
          local_300 = (float)*(int *)(in_RDI + 0x88) /
                      (float)((*(int *)(in_RDI + 0x88) - *(int *)(in_RDI + 0xa0)) - local_12c);
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          local_268 = (allocator_type *)Mat::row(&local_338,local_148 + -1);
          Mat::~Mat((Mat *)0x121aea);
          for (local_33c = 0; local_33c < local_144; local_33c = local_33c + 1) {
            *(float *)(local_268 + (long)local_33c * 4) =
                 local_300 * *(float *)(local_268 + (long)local_33c * 4);
          }
        }
        if (*(int *)(in_RDI + 0x94) != 0) {
          local_340 = (float)*(int *)(in_RDI + 0x84) /
                      (float)(*(int *)(in_RDI + 0x84) - *(int *)(in_RDI + 0x94));
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          local_268 = (allocator_type *)Mat::operator_cast_to_float_(&local_378);
          Mat::~Mat((Mat *)0x121bef);
          for (local_37c = 0; local_37c < local_148; local_37c = local_37c + 1) {
            *(float *)local_268 = local_340 * *(float *)local_268;
            local_268 = local_268 + (long)local_144 * 4;
          }
        }
        if (*(int *)(in_RDI + 0x98) + local_128 != 0) {
          local_380 = (float)*(int *)(in_RDI + 0x84) /
                      (float)((*(int *)(in_RDI + 0x84) - *(int *)(in_RDI + 0x98)) - local_128);
          Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                       (int)((ulong)in_stack_fffffffffffffb90 >> 0x20));
          in_stack_fffffffffffffba0 = (allocator_type *)Mat::operator_cast_to_float_(&local_3b8);
          local_268 = in_stack_fffffffffffffba0;
          Mat::~Mat((Mat *)0x121d1d);
          local_268 = local_268 + (long)(local_144 + -1) * 4;
          for (local_3bc = 0; local_3bc < local_148; local_3bc = local_3bc + 1) {
            *(float *)local_268 = local_380 * *(float *)local_268;
            local_268 = local_268 + (long)local_144 * 4;
          }
        }
        Mat::~Mat((Mat *)0x121ddb);
      }
    }
    local_4 = 0;
    local_138 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffba0);
  }
LAB_00121e38:
  Mat::~Mat((Mat *)0x121e45);
  return local_4;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}